

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDate.cpp
# Opt level: O2

void __thiscall PDFDate::SetToCurrentTime(PDFDate *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  tm *ptVar8;
  time_t __time1;
  ulong uVar9;
  ulong uVar10;
  EUTCRelation EVar11;
  double dVar12;
  time_t localEpoch;
  time_t currentTime;
  
  time(&currentTime);
  ptVar8 = localtime(&currentTime);
  uVar1 = ptVar8->tm_mon;
  uVar2 = ptVar8->tm_year;
  iVar4 = ptVar8->tm_sec;
  iVar5 = ptVar8->tm_min;
  iVar6 = ptVar8->tm_hour;
  iVar7 = ptVar8->tm_mday;
  this->Year = uVar2 + 0x76c;
  this->Month = uVar1 + 1;
  this->Day = iVar7;
  this->Hour = iVar6;
  this->Minute = iVar5;
  this->Second = iVar4;
  localEpoch = time((time_t *)0x0);
  ptVar8 = gmtime(&localEpoch);
  ptVar8->tm_isdst = -1;
  __time1 = mktime(ptVar8);
  dVar12 = difftime(__time1,localEpoch);
  uVar9 = (ulong)dVar12;
  if (uVar9 == 0) {
    EVar11 = eSame;
  }
  else {
    EVar11 = (EUTCRelation)((long)uVar9 < 1);
    uVar10 = -uVar9;
    if (0 < (long)uVar9) {
      uVar10 = uVar9;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar10;
    this->HourFromUTC = SUB164(auVar3 / ZEXT816(0xe10),0);
    this->MinuteFromUTC = (int)((long)(SUB168(auVar3 / ZEXT816(0xe10),0) * -0xe10 + uVar10) / 0x3c);
  }
  this->UTC = EVar11;
  return;
}

Assistant:

void PDFDate::SetToCurrentTime()
{
	time_t currentTime;
	tm structuredLocalTime;
	long timeZoneSecondsDifference;

	time(&currentTime);
	SAFE_LOCAL_TIME(structuredLocalTime,currentTime);

	Year = structuredLocalTime.tm_year + 1900;
	Month = structuredLocalTime.tm_mon + 1;
	Day = structuredLocalTime.tm_mday;
	Hour = structuredLocalTime.tm_hour;
	Minute = structuredLocalTime.tm_min;
	Second = structuredLocalTime.tm_sec;

	// if unsuccesful or method unknown don't provide UTC info (currently only knows for WIN32 and OSX
#if defined (__MWERKS__) || defined (__GNUC__)  || defined(_AIX32) || defined(WIN32)
	int status;
#if !defined(__MWERKS__) // (using c methods)
	struct tm *gmTime;

	time_t localEpoch, gmEpoch;

	/*First get local epoch time*/
	localEpoch = time(NULL);

	/* Using local time epoch get the GM Time */
	gmTime = gmtime(&localEpoch);
	gmTime->tm_isdst = -1;
	/* Convert gm time in to epoch format */
	gmEpoch = mktime(gmTime);

	timeZoneSecondsDifference =difftime(gmEpoch, localEpoch);
	status = 0;
#else // __MWERKS__ (using OSX methods)
	CFTimeZoneRef tzRef = ::CFTimeZoneCopySystem();
	if (tzRef)
	{
		CFTimeInterval intervalFromGMT = ::CFTimeZoneGetSecondsFromGMT(tzRef, currentTime);
		::CFRelease(tzRef);
		timeZoneSecondsDifference = intervalFromGMT;
		status = 0;
	}
	else
		status = -1;
#endif

	if(0 == status)
	{
		if(0 == timeZoneSecondsDifference)
		{
			UTC = eSame;
		}
		else
		{
			UTC = timeZoneSecondsDifference > 0 ? eEarlier : eLater;
			HourFromUTC = (int)(labs(timeZoneSecondsDifference) / 3600);
			MinuteFromUTC = (int)((labs(timeZoneSecondsDifference) - (labs(timeZoneSecondsDifference) / 3600)*3600) / 60);
		}
	}
	else
	{
		UTC = eUndefined;
		TRACE_LOG("PDFDate::SetToCurrentTime, Couldn't get UTC.");
	}

#else
	UTC = eUndefined;
#endif
}